

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O1

char * __thiscall Assimp::ColladaParser::GetTextContent(ColladaParser *this)

{
  char *pcVar1;
  string local_38;
  
  pcVar1 = TestTextContent(this);
  if (pcVar1 != (char *)0x0) {
    return pcVar1;
  }
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"Invalid contents in element \"n\".","");
  ThrowException(this,&local_38);
}

Assistant:

const char* ColladaParser::GetTextContent()
{
    const char* sz = TestTextContent();
    if (!sz) {
        ThrowException("Invalid contents in element \"n\".");
    }
    return sz;
}